

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

size_t __thiscall
Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>::DecommitFreePages
          (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this,size_t pageToDecommit)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  uint uVar4;
  undefined8 *in_FS_OFFSET;
  bool local_39;
  uint pageCount_1;
  uint pageCount;
  uint decommitCount;
  uint index;
  uint startIndex;
  size_t pageToDecommit_local;
  PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *this_local;
  
  if ((pageToDecommit == 0) || (uVar4 = GetAvailablePageCount(this), uVar4 == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x250,"(pageToDecommit != 0 && this->GetAvailablePageCount() > 0)",
                       "pageToDecommit != 0 && this->GetAvailablePageCount() > 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  decommitCount = 0;
  pageCount = 0;
  pageCount_1 = 0;
  do {
    BVar3 = TestInFreePagesBitVector(this,pageCount);
    if (BVar3 == '\0') {
      if (decommitCount < pageCount) {
        DecommitFreePagesInternal(this,decommitCount,pageCount - decommitCount);
      }
      decommitCount = pageCount + 1;
    }
    else {
      pageCount_1 = pageCount_1 + 1;
    }
    pageCount = pageCount + 1;
    uVar4 = GetAvailablePageCount(this);
    local_39 = pageCount < uVar4 && pageCount_1 < pageToDecommit;
  } while (local_39);
  if (decommitCount < pageCount) {
    DecommitFreePagesInternal(this,decommitCount,pageCount - decommitCount);
  }
  if (this->freePageCount < pageCount_1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0x26b,"(decommitCount <= this->freePageCount)",
                       "decommitCount <= this->freePageCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  this->decommitPageCount = pageCount_1 + this->decommitPageCount;
  this->freePageCount = this->freePageCount - pageCount_1;
  return (ulong)pageCount_1;
}

Assistant:

size_t
PageSegmentBase<T>::DecommitFreePages(size_t pageToDecommit)
{
    Assert(pageToDecommit != 0 && this->GetAvailablePageCount() > 0);

    uint startIndex = 0, index = 0, decommitCount = 0;
    do
    {
        if (!this->TestInFreePagesBitVector(index))
        {
            if (startIndex < index)
            {
                uint pageCount = index - startIndex;
                this->DecommitFreePagesInternal(startIndex, pageCount);
            }
            startIndex = index + 1;
        }
        else
        {
            decommitCount++;
        }
    }
    while (++index < this->GetAvailablePageCount() && decommitCount < pageToDecommit);

    if (startIndex < index)
    {
        uint pageCount = index - startIndex;
        this->DecommitFreePagesInternal(startIndex, pageCount);
    }

    Assert(decommitCount <= this->freePageCount);
    this->decommitPageCount += decommitCount;
    this->freePageCount -= decommitCount;
    return decommitCount;
}